

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O2

void s3clr_fattr(void)

{
  long lVar1;
  int iVar2;
  int32 *piVar3;
  
  piVar3 = alloc;
  iVar2 = 0;
  for (lVar1 = 0; *(void **)((long)attrib + lVar1) != (void *)0x0; lVar1 = lVar1 + 8) {
    if (*piVar3 != 0) {
      free(*(void **)((long)attrib + lVar1));
      free(*(void **)((long)value + lVar1));
      *piVar3 = 0;
    }
    iVar2 = iVar2 + 1;
    piVar3 = piVar3 + 1;
  }
  if (n_attrib == iVar2) {
    n_attrib = 0;
    value[0] = (char *)0x0;
    attrib[0] = (char *)0x0;
    return;
  }
  __assert_fail("i == n_attrib",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,0x52,"void s3clr_fattr()");
}

Assistant:

void s3clr_fattr()
{
    int i;

    for (i = 0; attrib[i]; i++) {
	if (alloc[i]) {
	    if (attrib[i]) {
		free(attrib[i]);
	    }
	    if (value[i]) {
		free(value[i]);
	    }	    
	    alloc[i] = FALSE;
	}
    }
    assert(i == n_attrib);
    n_attrib = 0;
    attrib[0] = value[0] = NULL;
}